

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exefilter.hpp
# Opt level: O0

streamsize __thiscall
stream::inno_exe_decoder_5200::
read<boost::iostreams::detail::linked_streambuf<char,std::char_traits<char>>>
          (inno_exe_decoder_5200 *this,linked_streambuf<char,_std::char_traits<char>_> *src,
          char *dest,streamsize n)

{
  byte bVar1;
  type tVar2;
  streamsize sVar3;
  uint uVar4;
  long in_RCX;
  byte *pbVar5;
  byte *in_RDX;
  byte *pbVar6;
  byte *in_RDI;
  size_t buffer_i_2;
  uint32_t rel;
  uint32_t addr;
  size_t buffer_i_1;
  streamsize nread;
  char *dst;
  size_t block_size_left;
  int byte;
  size_t buffer_i;
  char *end;
  type *in_stack_ffffffffffffff78;
  linked_streambuf<char,_std::char_traits<char>_> *in_stack_ffffffffffffff80;
  long local_70;
  long local_60;
  long local_38;
  byte *local_20;
  long local_8;
  
  pbVar5 = in_RDX + in_RCX;
  local_20 = in_RDX;
  if ('\0' < (char)in_RDI[8]) {
    in_RDI[8] = in_RDI[8];
    local_38 = 0;
    local_20 = in_RDX;
    do {
      if (local_20 == pbVar5) {
        memmove(in_RDI + 9,in_RDI + local_38 + 9,(long)(char)in_RDI[8]);
        return in_RCX - ((long)pbVar5 - (long)local_20);
      }
      pbVar6 = local_20 + 1;
      *local_20 = in_RDI[local_38 + 9];
      bVar1 = in_RDI[8];
      in_RDI[8] = bVar1 - 1;
      local_38 = local_38 + 1;
      local_20 = pbVar6;
    } while ((byte)(bVar1 - 1) != 0);
  }
LAB_001b2c4b:
  if (local_20 == pbVar5) {
    return in_RCX - ((long)pbVar5 - (long)local_20);
  }
  if (in_RDI[8] == 0) goto code_r0x001b2c6a;
  goto LAB_001b2d78;
code_r0x001b2c6a:
  tVar2 = boost::iostreams::
          get<boost::iostreams::detail::linked_streambuf<char,std::char_traits<char>>>
                    ((linked_streambuf<char,_std::char_traits<char>_> *)0x1b2c74);
  if (tVar2 == -1) {
    if (in_RCX != (long)pbVar5 - (long)local_20) {
      return in_RCX - ((long)pbVar5 - (long)local_20);
    }
    return -1;
  }
  if (tVar2 == -2) {
    return in_RCX - ((long)pbVar5 - (long)local_20);
  }
  pbVar6 = local_20 + 1;
  *local_20 = (byte)tVar2;
  *(int *)(in_RDI + 4) = *(int *)(in_RDI + 4) + 1;
  local_20 = pbVar6;
  if (((tVar2 == 0xe8) || (tVar2 == 0xe9)) &&
     (4 < 0x10000 - ((ulong)(*(int *)(in_RDI + 4) - 1) & 0xffff))) {
    in_RDI[8] = 0xfc;
LAB_001b2d78:
    sVar3 = boost::iostreams::
            read<boost::iostreams::detail::linked_streambuf<char,std::char_traits<char>>>
                      (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0x1b2db1);
    if (sVar3 == -1) {
      if ('\0' < (char)(in_RDI[8] + 4)) {
        in_RDI[8] = in_RDI[8] + 4;
        local_60 = 0;
        do {
          if (local_20 == pbVar5) {
            memmove(in_RDI + 9,in_RDI + local_60 + 9,(long)(char)in_RDI[8]);
            return in_RCX - ((long)pbVar5 - (long)local_20);
          }
          pbVar6 = local_20 + 1;
          *local_20 = in_RDI[local_60 + 9];
          bVar1 = in_RDI[8];
          in_RDI[8] = bVar1 - 1;
          local_60 = local_60 + 1;
          local_20 = pbVar6;
        } while ((byte)(bVar1 - 1) != 0);
      }
      if (in_RCX == (long)pbVar5 - (long)local_20) {
        local_8 = -1;
      }
      else {
        local_8 = in_RCX - ((long)pbVar5 - (long)local_20);
      }
      return local_8;
    }
    in_RDI[8] = in_RDI[8] + (char)sVar3;
    *(int *)(in_RDI + 4) = (int)sVar3 + *(int *)(in_RDI + 4);
    if (in_RDI[8] != 0) {
      return in_RCX - ((long)pbVar5 - (long)local_20);
    }
    if ((in_RDI[0xc] == 0) || (in_RDI[0xc] == 0xff)) {
      uVar4 = (uint)*(uint3 *)(in_RDI + 9) - (*(uint *)(in_RDI + 4) & 0xffffff);
      in_RDI[9] = (byte)uVar4;
      in_RDI[10] = (byte)(uVar4 >> 8);
      in_RDI[0xb] = (byte)(uVar4 >> 0x10);
      if (((*in_RDI & 1) != 0) && ((uVar4 & 0x800000) != 0)) {
        in_RDI[0xc] = in_RDI[0xc] ^ 0xff;
      }
    }
    in_RDI[8] = 4;
    local_70 = 0;
    do {
      if (local_20 == pbVar5) {
        memmove(in_RDI + 9,in_RDI + local_70 + 9,(long)(char)in_RDI[8]);
        return in_RCX - ((long)pbVar5 - (long)local_20);
      }
      pbVar6 = local_20 + 1;
      *local_20 = in_RDI[local_70 + 9];
      bVar1 = in_RDI[8];
      in_RDI[8] = bVar1 - 1;
      local_70 = local_70 + 1;
      local_20 = pbVar6;
    } while ((byte)(bVar1 - 1) != 0);
  }
  goto LAB_001b2c4b;
}

Assistant:

std::streamsize inno_exe_decoder_5200::read(Source & src, char * dest, std::streamsize n) {
	
	char * end = dest + n;
	
	//! Total number of filtered bytes read and written to dest.
#define total_read     (n - (end - dest))
	
#define flush(N) \
	{ \
		if((N) > 0) { \
			flush_bytes = (N); \
			size_t buffer_i = 0; \
			do { \
				if(dest == end) { \
					memmove(buffer, buffer + buffer_i, size_t(flush_bytes)); \
					return total_read; \
				} \
				*dest++ = char(buffer[buffer_i++]); \
			} while(--flush_bytes); \
		} \
	} (void)0
	
	
	// Flush already processed address bytes.
	flush(flush_bytes);
	
	while(dest != end) {
		
		if(!flush_bytes) {
			
			// Check if this is a CALL or JMP instruction.
			int byte = boost::iostreams::get(src);
			if(byte == EOF) { return total_read ? total_read : EOF; }
			if(byte == boost::iostreams::WOULD_BLOCK) { return total_read; }
			*dest++ = char(byte);
			offset++;
			if(byte != 0xe8 && byte != 0xe9) {
				// Not a CALL or JMP instruction.
				continue;
			}
			
			const size_t block_size_left = block_size - ((offset - 1) % block_size);
			if(block_size_left < 5) {
				// Ignore instructions that span blocks.
				continue;
			}
			
			flush_bytes = -4;
		}
		
		assert(flush_bytes < 0);
		
		// Read all four address bytes.
		char * dst = reinterpret_cast<char *>(buffer + 4 + flush_bytes);
		std::streamsize nread = boost::iostreams::read(src, dst, -flush_bytes);
		if(nread == EOF) {
			flush(boost::int8_t(4 + flush_bytes));
			return total_read ? total_read : EOF;
		}
		flush_bytes = boost::int8_t(flush_bytes + nread), offset += boost::uint32_t(nread);
		if(flush_bytes) { return total_read; }
		
		// Verify that the high byte of the address is 0x00 or 00xff.
		if(buffer[3] == 0x00 || buffer[3] == 0xff) {
			
			boost::uint32_t addr = offset & 0xffffff; // may wrap, but OK
			
			boost::uint32_t rel = buffer[0] | (boost::uint32_t(buffer[1]) << 8)
			                                | (boost::uint32_t(buffer[2]) << 16);
			rel -= addr;
			buffer[0] = boost::uint8_t(rel);
			buffer[1] = boost::uint8_t(rel >> 8);
			buffer[2] = boost::uint8_t(rel >> 16);
			
			if(flip_high_byte) {
				// For a slightly higher compression ratio, we want the resulting high
				// byte to be 0x00 for both forward and backward jumps. The high byte
				// of the original relative address is likely to be the sign extension
				// of bit 23, so if bit 23 is set, toggle all bits in the high byte.
				if(rel & 0x800000) {
					buffer[3] = boost::uint8_t(~buffer[3]);
				}
			}
			
		} else {
			// This is most likely not a CALL or JUMP.
		}
		
		flush(4);
	}
	
	return total_read;
	
#undef flush
#undef total_read
	
}